

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

time_t isodate7(uchar *v)

{
  int iVar1;
  byte *in_RDI;
  time_t t;
  int offset;
  tm_conflict tm;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  int local_38;
  uint local_34;
  byte *local_10;
  time_t local_8;
  
  local_10 = in_RDI;
  memset(&local_48,0,0x38);
  local_34 = (uint)*local_10;
  local_38 = local_10[1] - 1;
  local_3c = (uint)local_10[2];
  local_40 = (uint)local_10[3];
  local_44 = (uint)local_10[4];
  local_48 = (uint)local_10[5];
  iVar1 = (int)(char)local_10[6];
  if ((-0x30 < iVar1) && (iVar1 < 0x34)) {
    local_40 = local_40 - iVar1 / 4;
    local_44 = local_44 + (iVar1 % 4) * -0xf;
  }
  local_8 = time_from_tm((tm_conflict *)0x1392e0);
  if (local_8 == -1) {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static time_t
isodate7(const unsigned char *v)
{
	struct tm tm;
	int offset;
	time_t t;

	memset(&tm, 0, sizeof(tm));
	tm.tm_year = v[0];
	tm.tm_mon = v[1] - 1;
	tm.tm_mday = v[2];
	tm.tm_hour = v[3];
	tm.tm_min = v[4];
	tm.tm_sec = v[5];
	/* v[6] is the signed timezone offset, in 1/4-hour increments. */
	offset = ((const signed char *)v)[6];
	if (offset > -48 && offset < 52) {
		tm.tm_hour -= offset / 4;
		tm.tm_min -= (offset % 4) * 15;
	}
	t = time_from_tm(&tm);
	if (t == (time_t)-1)
		return ((time_t)0);
	return (t);
}